

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaMan.c
# Opt level: O0

void Gia_ManPrintInitClasses(Vec_Int_t *vInits)

{
  int iVar1;
  uint local_38 [2];
  int Counts [6];
  uint local_14;
  int Value;
  int i;
  Vec_Int_t *vInits_local;
  
  memset(local_38,0,0x18);
  for (local_14 = 0; iVar1 = Vec_IntSize(vInits), (int)local_14 < iVar1; local_14 = local_14 + 1) {
    iVar1 = Vec_IntEntry(vInits,local_14);
    local_38[iVar1] = local_38[iVar1] + 1;
  }
  for (local_14 = 0; (int)local_14 < 6; local_14 = local_14 + 1) {
    if (local_38[(int)local_14] != 0) {
      printf("%d = %d  ",(ulong)local_14,(ulong)local_38[(int)local_14]);
    }
  }
  printf("  ");
  printf("B = %d  ",(ulong)(local_38[0] + local_38[1]));
  printf("X = %d  ",(ulong)(uint)(Counts[0] + Counts[1]));
  printf("Q = %d\n",(ulong)(uint)(Counts[2] + Counts[3]));
  local_14 = 0;
  do {
    iVar1 = Vec_IntSize(vInits);
    if (iVar1 <= (int)local_14) {
      printf("\n");
      return;
    }
    iVar1 = Vec_IntEntry(vInits,local_14);
    local_38[iVar1] = local_38[iVar1] + 1;
    if (iVar1 == 0) {
      printf("0");
    }
    else if (iVar1 == 1) {
      printf("1");
    }
    else if (iVar1 == 2) {
      printf("2");
    }
    else if (iVar1 == 3) {
      printf("3");
    }
    else if (iVar1 == 4) {
      printf("4");
    }
    else {
      if (iVar1 != 5) {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaMan.c"
                      ,0x17f,"void Gia_ManPrintInitClasses(Vec_Int_t *)");
      }
      printf("5");
    }
    local_14 = local_14 + 1;
  } while( true );
}

Assistant:

void Gia_ManPrintInitClasses( Vec_Int_t * vInits )
{
    int i, Value;
    int Counts[6] = {0};
    Vec_IntForEachEntry( vInits, Value, i )
        Counts[Value]++;
    for ( i = 0; i < 6; i++ )
        if ( Counts[i] )
            printf( "%d = %d  ", i, Counts[i] );
    printf( "  " );
    printf( "B = %d  ", Counts[0] + Counts[1] );
    printf( "X = %d  ", Counts[2] + Counts[3] );
    printf( "Q = %d\n", Counts[4] + Counts[5] );
    Vec_IntForEachEntry( vInits, Value, i )
    {
        Counts[Value]++;
        if ( Value == 0 )
            printf( "0" );
        else if ( Value == 1 )
            printf( "1" );
        else if ( Value == 2 )
            printf( "2" );
        else if ( Value == 3 )
            printf( "3" );
        else if ( Value == 4 )
            printf( "4" );
        else if ( Value == 5 )
            printf( "5" );
        else assert( 0 );
    }
    printf( "\n" );
    
}